

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::throwErrorIfNotReadableType(Expression *e)

{
  Statement *pSVar1;
  bool bVar2;
  CompileMessage local_90;
  CompileMessage local_48;
  Expression *local_10;
  Expression *e_local;
  
  local_10 = e;
  bVar2 = AST::isResolvedAsType(e);
  if (bVar2) {
    return;
  }
  bVar2 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(local_10);
  if (!bVar2) {
    pSVar1 = &local_10->super_Statement;
    Errors::expectedType<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_90,false);
  }
  pSVar1 = &local_10->super_Statement;
  Errors::cannotUseProcessorAsType<>();
  AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_48,false);
}

Assistant:

static void throwErrorIfNotReadableType (AST::Expression& e)
    {
        if (! AST::isResolvedAsType (e))
        {
            if (is_type<AST::ProcessorRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsType());

            e.context.throwError (Errors::expectedType());
        }
    }